

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O2

void __thiscall
aeron::archive::ArchiveProxy::ArchiveProxy
          (ArchiveProxy *this,shared_ptr<aeron::ExclusivePublication> *publication,
          int64_t connectTimeoutNs,int32_t retryAttempts)

{
  std::__shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2> *)this,
             &publication->
              super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>);
  (this->buffer_)._vptr_AtomicBuffer = (_func_int **)&PTR__AtomicBuffer_0016f998;
  (this->buffer_).m_buffer = (this->underlyingBuffer_)._M_elems;
  (this->buffer_).m_length = 0x1000;
  (this->connectTimeoutNs_).__r = connectTimeoutNs;
  this->retryAttempts_ = retryAttempts;
  return;
}

Assistant:

ArchiveProxy::ArchiveProxy(const std::shared_ptr<aeron::ExclusivePublication>& publication,
                           std::int64_t connectTimeoutNs, std::int32_t retryAttempts)
    : publication_(publication)
    , buffer_(&underlyingBuffer_[0], underlyingBuffer_.size())
    , connectTimeoutNs_(connectTimeoutNs)
    , retryAttempts_(retryAttempts) {}